

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TimingCheckEventSyntax::setChild
          (TimingCheckEventSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  TimingCheckConditionSyntax *pTVar2;
  EdgeControlSpecifierSyntax *pEVar3;
  logic_error *this_00;
  Token TVar4;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 4) {
    switch(index) {
    case 0:
      TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->edge).kind = TVar4.kind;
      (this->edge).field_0x2 = TVar4._2_1_;
      (this->edge).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
      (this->edge).rawLen = TVar4.rawLen;
      (this->edge).info = TVar4.info;
      break;
    case 1:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        pEVar3 = (EdgeControlSpecifierSyntax *)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        pEVar3 = SyntaxNode::as<slang::syntax::EdgeControlSpecifierSyntax>(pSVar1);
      }
      this->controlSpecifier = pEVar3;
      break;
    case 2:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
      }
      not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
                ((not_null<slang::syntax::NameSyntax*> *)&local_b8,(NameSyntax **)&local_d8);
      (this->terminal).ptr = (NameSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 3:
      pSVar1 = TokenOrSyntax::node(&child);
      if (pSVar1 == (SyntaxNode *)0x0) {
        pTVar2 = (TimingCheckConditionSyntax *)0x0;
      }
      else {
        pSVar1 = TokenOrSyntax::node(&child);
        pTVar2 = SyntaxNode::as<slang::syntax::TimingCheckConditionSyntax>(pSVar1);
      }
      this->condition = pTVar2;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x31ea);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void TimingCheckEventSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: edge = child.token(); return;
        case 1: controlSpecifier = child.node() ? &child.node()->as<EdgeControlSpecifierSyntax>() : nullptr; return;
        case 2: terminal = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 3: condition = child.node() ? &child.node()->as<TimingCheckConditionSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}